

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void delete_bb_insn(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  bitmap_t pVVar1;
  bb_insn_t pbVar2;
  dead_var_t_conflict pdVar3;
  dead_var_t pdVar4;
  HTAB_MIR_item_t *pHVar5;
  long lVar6;
  MIR_item_t pMVar7;
  size_t sVar8;
  bb_t_conflict bb;
  DLIST_LINK_bb_insn_t *pDVar9;
  DLIST_LINK_dead_var_t *pDVar10;
  DLIST_dead_var_t *pDVar11;
  char **ppcVar12;
  HTAB_MIR_item_t **ppHVar13;
  size_t *rpost;
  MIR_context_t pMVar14;
  VARR_uint8_t *dv;
  gen_ctx_t gen_ctx_00;
  gen_ctx_t __ptr;
  
  DLIST_bb_insn_t_remove(&bb_insn->bb->bb_insns,bb_insn);
  bb_insn->insn->data = (void *)0x0;
  pMVar14 = (MIR_context_t)bb_insn;
  clear_bb_insn_dead_vars(gen_ctx,bb_insn);
  pVVar1 = bb_insn->call_hard_reg_args;
  if (pVVar1 == (bitmap_t)0x0) {
LAB_0015fd5f:
    free(bb_insn);
    return;
  }
  gen_ctx_00 = (gen_ctx_t)pVVar1->varr;
  if (gen_ctx_00 != (gen_ctx_t)0x0) {
    free(gen_ctx_00);
    free(pVVar1);
    goto LAB_0015fd5f;
  }
  delete_bb_insn_cold_1();
  if ((gen_ctx_00 != (gen_ctx_t)0x0) && (pMVar14 != (MIR_context_t)0x0)) {
    pbVar2 = ((DLIST_LINK_bb_insn_t *)&pMVar14->insn_nops)->prev;
    if (pbVar2 == (bb_insn_t)0x0) {
      if (gen_ctx_00->ctx != pMVar14) goto LAB_0015fdcf;
      gen_ctx_00->ctx = (MIR_context_t)pMVar14->unspec_protos;
    }
    else {
      (pbVar2->bb_insn_link).next = (bb_insn_t)pMVar14->unspec_protos;
    }
    if ((bb_insn_t)pMVar14->unspec_protos == (bb_insn_t)0x0) {
      if (*(MIR_context_t *)&gen_ctx_00->optimize_level != pMVar14) goto LAB_0015fdd4;
      pDVar9 = (DLIST_LINK_bb_insn_t *)&gen_ctx_00->optimize_level;
    }
    else {
      pDVar9 = &((bb_insn_t)pMVar14->unspec_protos)->bb_insn_link;
    }
    pDVar9->prev = pbVar2;
    ((DLIST_LINK_bb_insn_t *)&pMVar14->insn_nops)->prev = (bb_insn_t)0x0;
    pMVar14->unspec_protos = (VARR_MIR_proto_t *)0x0;
    return;
  }
  DLIST_bb_insn_t_remove_cold_1();
LAB_0015fdcf:
  DLIST_bb_insn_t_remove_cold_2();
LAB_0015fdd4:
  DLIST_bb_insn_t_remove_cold_3();
  dv = (VARR_uint8_t *)((DLIST_dead_var_t *)&pMVar14->temp_data)->head;
  if (dv != (VARR_uint8_t *)0x0) {
    __ptr = gen_ctx_00;
    do {
      pdVar3 = ((DLIST_LINK_dead_var_t *)&dv->size)->prev;
      pDVar11 = (DLIST_dead_var_t *)&(pdVar3->dead_var_link).next;
      if (pdVar3 == (dead_var_t_conflict)0x0) {
        pDVar11 = (DLIST_dead_var_t *)&pMVar14->temp_data;
      }
      pDVar11->head = (dead_var_t_conflict)dv->varr;
      if ((dead_var_t)dv->varr == (dead_var_t)0x0) {
        pDVar10 = (DLIST_LINK_dead_var_t *)&pMVar14->used_label_p;
        if (pMVar14->used_label_p != dv) {
          clear_bb_insn_dead_vars_cold_1();
          pdVar4 = (__ptr->free_dead_vars).tail;
          if (pdVar4 == (dead_var_t)0x0) {
            if ((__ptr->free_dead_vars).head == (dead_var_t_conflict)0x0) {
              pDVar11 = &__ptr->free_dead_vars;
              goto LAB_0015fe77;
            }
          }
          else {
            if ((pdVar4->dead_var_link).next == (dead_var_t)0x0) {
              pDVar11 = (DLIST_dead_var_t *)&(pdVar4->dead_var_link).next;
LAB_0015fe77:
              pDVar11->head = (dead_var_t_conflict)dv;
              dv->varr = (uint8_t *)0x0;
              ((DLIST_LINK_dead_var_t *)&dv->size)->prev = pdVar4;
              (__ptr->free_dead_vars).tail = (dead_var_t_conflict)dv;
              return;
            }
            free_dead_var_cold_1();
          }
          free_dead_var_cold_2();
          pMVar14 = __ptr->ctx;
          pHVar5 = *(HTAB_MIR_item_t **)&__ptr->debug_level;
          if (pHVar5 != (HTAB_MIR_item_t *)0x0) {
            pHVar5->free_func = (_func_void_MIR_item_t_void_ptr *)__ptr->to_free;
LAB_0015fec2:
            if (__ptr->to_free == (VARR_void_ptr_t *)0x0) {
              if ((gen_ctx_t)pMVar14->module_item_tab != __ptr) goto LAB_0015ff44;
              ppHVar13 = &pMVar14->module_item_tab;
            }
            else {
              ppHVar13 = (HTAB_MIR_item_t **)&__ptr->to_free[1].size;
            }
            *ppHVar13 = pHVar5;
            *(undefined8 *)&__ptr->debug_level = 0;
            __ptr->to_free = (VARR_void_ptr_t *)0x0;
            lVar6 = *(long *)&__ptr->optimize_level;
            pMVar7 = __ptr->curr_func_item;
            if (pMVar7 == (MIR_item_t)0x0) {
              if (*(gen_ctx_t *)(lVar6 + 0x30) != __ptr) goto LAB_0015ff49;
              *(FILE **)(lVar6 + 0x30) = __ptr->debug_file;
            }
            else {
              (pMVar7->item_link).next = (MIR_item_t)__ptr->debug_file;
            }
            if (__ptr->debug_file == (FILE *)0x0) {
              if (*(gen_ctx_t *)(lVar6 + 0x38) != __ptr) goto LAB_0015ff4e;
              ppcVar12 = (char **)(lVar6 + 0x38);
            }
            else {
              ppcVar12 = &__ptr->debug_file->_IO_read_end;
            }
            *ppcVar12 = (char *)pMVar7;
            __ptr->curr_func_item = (MIR_item_t)0x0;
            __ptr->debug_file = (FILE *)0x0;
            free(__ptr);
            return;
          }
          if ((gen_ctx_t)pMVar14->used_label_p == __ptr) {
            pMVar14->used_label_p = (VARR_uint8_t *)__ptr->to_free;
            goto LAB_0015fec2;
          }
          delete_edge_cold_1();
LAB_0015ff44:
          delete_edge_cold_2();
LAB_0015ff49:
          delete_edge_cold_3();
LAB_0015ff4e:
          delete_edge_cold_4();
          sVar8 = dv->els_num;
          dv->els_num = sVar8 + 1;
          *(size_t *)&__ptr->optimize_level = sVar8;
          for (pVVar1 = __ptr->addr_regs; pVVar1 != (bitmap_t)0x0; pVVar1 = (bitmap_t)pVVar1[1].varr
              ) {
            bb = (bb_t_conflict)pVVar1->size;
            if (bb->pre == 0) {
              DFS(bb,&dv->els_num,rpost);
            }
            else if (bb->rpost == 0) {
              *(undefined1 *)((long)&pVVar1[2].els_num + 1) = 1;
            }
          }
          pMVar7 = (MIR_item_t)*rpost;
          *rpost = (size_t)((long)&pMVar7[-1].u + 7);
          __ptr->curr_func_item = pMVar7;
          return;
        }
      }
      else {
        pDVar10 = &((dead_var_t)dv->varr)->dead_var_link;
      }
      pDVar10->prev = pdVar3;
      ((DLIST_LINK_dead_var_t *)&dv->size)->prev = (dead_var_t)0x0;
      dv->varr = (uint8_t *)0x0;
      __ptr = gen_ctx_00;
      free_dead_var(gen_ctx_00,(dead_var_t_conflict)dv);
      dv = (VARR_uint8_t *)((DLIST_dead_var_t *)&pMVar14->temp_data)->head;
    } while (dv != (VARR_uint8_t *)0x0);
  }
  return;
}

Assistant:

static void delete_bb_insn (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  DLIST_REMOVE (bb_insn_t, bb_insn->bb->bb_insns, bb_insn);
  bb_insn->insn->data = NULL;
  clear_bb_insn_dead_vars (gen_ctx, bb_insn);
  if (bb_insn->call_hard_reg_args != NULL) bitmap_destroy (bb_insn->call_hard_reg_args);
  free (bb_insn);
}